

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O1

Slice __thiscall leveldb::CorruptionTest::Key(CorruptionTest *this,int i,string *storage)

{
  Slice SVar1;
  char buf [100];
  char acStack_78 [104];
  
  snprintf(acStack_78,100,"%016d",i);
  strlen(acStack_78);
  std::__cxx11::string::_M_replace
            ((ulong)storage,0,(char *)storage->_M_string_length,(ulong)acStack_78);
  SVar1.data_ = (storage->_M_dataplus)._M_p;
  SVar1.size_ = storage->_M_string_length;
  return SVar1;
}

Assistant:

Slice Key(int i, std::string* storage) {
    char buf[100];
    std::snprintf(buf, sizeof(buf), "%016d", i);
    storage->assign(buf, strlen(buf));
    return Slice(*storage);
  }